

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_trap_t::wasm_trap_t(wasm_trap_t *this,RefPtr<wabt::interp::Trap> *ptr)

{
  RefPtr<wabt::interp::Object> local_30;
  RefPtr<wabt::interp::Trap> *local_18;
  RefPtr<wabt::interp::Trap> *ptr_local;
  wasm_trap_t *this_local;
  
  local_18 = ptr;
  ptr_local = (RefPtr<wabt::interp::Trap> *)this;
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Trap>(&local_30,ptr);
  wasm_ref_t::wasm_ref_t(&this->super_wasm_ref_t,&local_30);
  wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_30);
  return;
}

Assistant:

wasm_trap_t(RefPtr<Trap> ptr) : wasm_ref_t(ptr) {}